

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindowSettings *pIVar5;
  ImGuiWindowSettings *pIVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar3 = (ctx->Windows).Size;
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      pIVar2 = (ctx->Windows).Data[uVar8];
      if ((pIVar2->Flags & 0x100) == 0) {
        if ((long)pIVar2->SettingsOffset == -1) {
          pcVar7 = (GImGui->SettingsWindows).Buf.Data;
          if (pcVar7 != (char *)0x0) {
            pIVar6 = (ImGuiWindowSettings *)(pcVar7 + 4);
            pIVar5 = pIVar6;
            do {
              if (pIVar5->ID == pIVar2->ID) goto LAB_00230670;
              pIVar5 = (ImGuiWindowSettings *)
                       ((long)&pIVar5->ID + (long)*(int *)&pIVar5[-1].Collapsed);
            } while (pIVar5 != (ImGuiWindowSettings *)
                               ((long)&pIVar6->ID + (long)(GImGui->SettingsWindows).Buf.Size));
          }
LAB_00230657:
          pIVar5 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          pIVar2->SettingsOffset = (int)pIVar5 - *(int *)&(ctx->SettingsWindows).Buf.Data;
        }
        else {
          pcVar7 = (ctx->SettingsWindows).Buf.Data;
          if (pcVar7 == (char *)0x0) goto LAB_00230657;
          pIVar5 = (ImGuiWindowSettings *)(pcVar7 + pIVar2->SettingsOffset);
        }
LAB_00230670:
        pIVar5->Pos = (ImVec2ih)((int)(pIVar2->Pos).x & 0xffffU | (int)(pIVar2->Pos).y << 0x10);
        pIVar5->Size = (ImVec2ih)
                       ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
        pIVar5->Collapsed = pIVar2->Collapsed;
        uVar3 = (ctx->Windows).Size;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  iVar1 = (buf->Buf).Size;
  iVar4 = iVar1 + -1;
  if (iVar1 == 0) {
    iVar4 = 0;
  }
  ImGuiTextBuffer::reserve(buf,iVar4 + (ctx->SettingsWindows).Buf.Size * 6);
  pcVar7 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar7 != (char *)0x0) {
    pcVar7 = pcVar7 + 4;
    do {
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pcVar7 + 0x10);
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar7 + 4),
                 (ulong)(uint)(int)*(short *)(pcVar7 + 6));
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar7 + 8),
                 (ulong)(uint)(int)*(short *)(pcVar7 + 10));
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)(byte)pcVar7[0xc]);
      ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      pcVar7 = pcVar7 + *(int *)(pcVar7 + -4);
    } while (pcVar7 != (ctx->SettingsWindows).Buf.Data + (long)(ctx->SettingsWindows).Buf.Size + 4);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}